

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<ClassDef::Interface>::emplace<ClassDef::Interface>
          (QMovableArrayOps<ClassDef::Interface> *this,qsizetype i,Interface *args)

{
  Interface **ppIVar1;
  Interface *pIVar2;
  Data *pDVar3;
  long lVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char *pcVar9;
  qsizetype qVar10;
  Interface *pIVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar3 = (this->super_QGenericArrayOps<ClassDef::Interface>).
           super_QArrayDataPointer<ClassDef::Interface>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<ClassDef::Interface>).
            super_QArrayDataPointer<ClassDef::Interface>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QGenericArrayOps<ClassDef::Interface>).
                      super_QArrayDataPointer<ClassDef::Interface>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pIVar11 = (this->super_QGenericArrayOps<ClassDef::Interface>).
                super_QArrayDataPointer<ClassDef::Interface>.ptr;
      pDVar5 = (args->className).d.d;
      (args->className).d.d = (Data *)0x0;
      pIVar11[lVar4].className.d.d = pDVar5;
      pcVar6 = (args->className).d.ptr;
      (args->className).d.ptr = (char *)0x0;
      pIVar11[lVar4].className.d.ptr = pcVar6;
      qVar7 = (args->className).d.size;
      (args->className).d.size = 0;
      pIVar11[lVar4].className.d.size = qVar7;
      pDVar5 = (args->interfaceId).d.d;
      (args->interfaceId).d.d = (Data *)0x0;
      pIVar11[lVar4].interfaceId.d.d = pDVar5;
      pcVar6 = (args->interfaceId).d.ptr;
      (args->interfaceId).d.ptr = (char *)0x0;
      pIVar11[lVar4].interfaceId.d.ptr = pcVar6;
      qVar7 = (args->interfaceId).d.size;
      (args->interfaceId).d.size = 0;
      pIVar11[lVar4].interfaceId.d.size = qVar7;
      goto LAB_00139eab;
    }
    if (((i == 0) && (pDVar3 != (Data *)0x0)) &&
       ((Interface *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) !=
        (this->super_QGenericArrayOps<ClassDef::Interface>).
        super_QArrayDataPointer<ClassDef::Interface>.ptr)) {
      pIVar11 = (this->super_QGenericArrayOps<ClassDef::Interface>).
                super_QArrayDataPointer<ClassDef::Interface>.ptr;
      pDVar5 = (args->className).d.d;
      (args->className).d.d = (Data *)0x0;
      pIVar11[-1].className.d.d = pDVar5;
      pcVar6 = (args->className).d.ptr;
      (args->className).d.ptr = (char *)0x0;
      pIVar11[-1].className.d.ptr = pcVar6;
      qVar7 = (args->className).d.size;
      (args->className).d.size = 0;
      pIVar11[-1].className.d.size = qVar7;
      pDVar5 = (args->interfaceId).d.d;
      (args->interfaceId).d.d = (Data *)0x0;
      pIVar11[-1].interfaceId.d.d = pDVar5;
      pcVar6 = (args->interfaceId).d.ptr;
      (args->interfaceId).d.ptr = (char *)0x0;
      pIVar11[-1].interfaceId.d.ptr = pcVar6;
      qVar7 = (args->interfaceId).d.size;
      (args->interfaceId).d.size = 0;
      pIVar11[-1].interfaceId.d.size = qVar7;
      ppIVar1 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
                 super_QArrayDataPointer<ClassDef::Interface>.ptr;
      *ppIVar1 = *ppIVar1 + -1;
      goto LAB_00139eab;
    }
  }
  pDVar5 = (args->className).d.d;
  pcVar6 = (args->className).d.ptr;
  (args->className).d.d = (Data *)0x0;
  (args->className).d.ptr = (char *)0x0;
  qVar7 = (args->className).d.size;
  pDVar8 = (args->interfaceId).d.d;
  (args->className).d.size = 0;
  (args->interfaceId).d.d = (Data *)0x0;
  pcVar9 = (args->interfaceId).d.ptr;
  qVar10 = (args->interfaceId).d.size;
  (args->interfaceId).d.ptr = (char *)0x0;
  (args->interfaceId).d.size = 0;
  bVar13 = (this->super_QGenericArrayOps<ClassDef::Interface>).
           super_QArrayDataPointer<ClassDef::Interface>.size != 0;
  QArrayDataPointer<ClassDef::Interface>::detachAndGrow
            ((QArrayDataPointer<ClassDef::Interface> *)this,(uint)(i == 0 && bVar13),1,
             (Interface **)0x0,(QArrayDataPointer<ClassDef::Interface> *)0x0);
  pIVar11 = (this->super_QGenericArrayOps<ClassDef::Interface>).
            super_QArrayDataPointer<ClassDef::Interface>.ptr;
  if (i == 0 && bVar13) {
    pIVar11[-1].className.d.d = pDVar5;
    pIVar11[-1].className.d.ptr = pcVar6;
    pIVar11[-1].className.d.size = qVar7;
    pIVar11[-1].interfaceId.d.d = pDVar8;
    pIVar11[-1].interfaceId.d.ptr = pcVar9;
    pIVar11[-1].interfaceId.d.size = qVar10;
    (this->super_QGenericArrayOps<ClassDef::Interface>).super_QArrayDataPointer<ClassDef::Interface>
    .ptr = pIVar11 + -1;
  }
  else {
    pIVar2 = pIVar11 + i;
    memmove(pIVar2 + 1,pIVar11 + i,
            ((this->super_QGenericArrayOps<ClassDef::Interface>).
             super_QArrayDataPointer<ClassDef::Interface>.size - i) * 0x30);
    (pIVar2->className).d.d = pDVar5;
    (pIVar2->className).d.ptr = pcVar6;
    (pIVar2->className).d.size = qVar7;
    (pIVar2->interfaceId).d.d = pDVar8;
    (pIVar2->interfaceId).d.ptr = pcVar9;
    (pIVar2->interfaceId).d.size = qVar10;
  }
LAB_00139eab:
  pqVar12 = &(this->super_QGenericArrayOps<ClassDef::Interface>).
             super_QArrayDataPointer<ClassDef::Interface>.size;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }